

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPSocket.cpp
# Opt level: O3

void __thiscall net_uv::KCPSocket::startIdle(KCPSocket *this)

{
  UVTimer *this_00;
  uint64_t uVar1;
  
  if (this->m_idle == (UVTimer *)0x0) {
    this_00 = (UVTimer *)malloc(0xa0);
    this->m_idle = this_00;
    UVTimer::UVTimer(this_00);
  }
  uVar1 = uv_now((this->super_Socket).m_loop);
  this->m_idleUpdateTime = uVar1;
  UVTimer::start(this->m_idle,(this->super_Socket).m_loop,
                 startIdle::anon_class_1_0_00000001::__invoke,1,1,this);
  return;
}

Assistant:

void KCPSocket::startIdle()
{
	if (m_idle == NULL)
	{
		m_idle = (UVTimer*)fc_malloc(sizeof(UVTimer));
		new (m_idle) UVTimer();
	}

	m_idleUpdateTime = uv_now(m_loop);
	m_idle->start(m_loop, [](uv_timer_t* handle)
	{
		KCPSocket* svr = (KCPSocket*)handle->data;
		svr->idleLogic();
	}, 1, 1, this);
}